

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# missing_deps.cc
# Opt level: O3

void __thiscall MissingDependencyScanner::PrintStats(MissingDependencyScanner *this)

{
  ostream *poVar1;
  long lVar2;
  char *pcVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Processed ",10);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," nodes.\n",8);
  if ((this->nodes_missing_deps_)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    pcVar3 = "No missing dependencies on generated files found.\n";
    lVar2 = 0x32;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Error: There are ",0x11);
    poVar1 = (ostream *)
             std::ostream::operator<<((ostream *)&std::cout,this->missing_dep_path_count_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," missing dependency paths.\n",0x1b);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1," targets had depfile dependencies on ",0x25);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," distinct generated inputs ",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"(from ",6);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," rules) ",8);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1," without a non-depfile dep path to the generator.\n",0x32);
    pcVar3 = 
    "There might be build flakiness if any of the targets listed above are built alone, or not late enough, in a clean output directory.\n"
    ;
    lVar2 = 0x84;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar3,lVar2);
  return;
}

Assistant:

void MissingDependencyScanner::PrintStats() {
  std::cout << "Processed " << seen_.size() << " nodes.\n";
  if (HadMissingDeps()) {
    std::cout << "Error: There are " << missing_dep_path_count_
              << " missing dependency paths.\n";
    std::cout << nodes_missing_deps_.size()
              << " targets had depfile dependencies on "
              << generated_nodes_.size() << " distinct generated inputs "
              << "(from " << generator_rules_.size() << " rules) "
              << " without a non-depfile dep path to the generator.\n";
    std::cout << "There might be build flakiness if any of the targets listed "
                 "above are built alone, or not late enough, in a clean output "
                 "directory.\n";
  } else {
    std::cout << "No missing dependencies on generated files found.\n";
  }
}